

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pack.c
# Opt level: O2

void packBE(uint8_t *p,uint32_t value,uint8_t u8Size)

{
  long lVar1;
  
  if ((byte)(u8Size - 1) < 4) {
    for (lVar1 = 0; (uint8_t)-u8Size != (char)lVar1; lVar1 = lVar1 + -1) {
      p[lVar1 + (ulong)(u8Size - 1)] = (uint8_t)value;
      value = value >> 8;
    }
  }
  return;
}

Assistant:

void packBE(_PACK_UINT8* p, _PACK_UINT32 value, _PACK_UINT8 u8Size)
{
   if ((u8Size > 0) && (u8Size <= sizeof(_PACK_UINT32)))
   {
#if defined(PLATFORM_BYTE_ORDER) && (PLATFORM_BYTE_ORDER==PLATFORM_BIG_ENDIAN)
      memcpy(p, &value, u8Size);
#else
      register _PACK_UINT32 tmp = value;
      p += (u8Size - 1);
      while (u8Size > 0)
      {
         *(p--) = (_PACK_UINT8)tmp;
         tmp = tmp >> 8;
         u8Size--;
      }
#endif
   }
}